

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

QSize __thiscall QWidgetPrivate::adjustedSize(QWidgetPrivate *this)

{
  QWidget *this_00;
  QLayout *pQVar1;
  QWExtra *pQVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  _Head_base<0UL,_QTLWExtra_*,_false> _Var8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  long in_FS_OFFSET;
  undefined1 auVar12 [16];
  QRect QVar13;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&this->field_0x8;
  uVar6 = (**(code **)(*(long *)this_00 + 0x70))(this_00);
  uVar10 = uVar6 >> 0x20;
  uVar4 = (uint)(uVar6 >> 0x20);
  if (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
       super_QFlagsStorage<Qt::WindowType>.i & 1) != 0) {
    pQVar1 = this->layout;
    uVar9 = (uint)uVar6;
    if (pQVar1 == (QLayout *)0x0) {
      if ((*(byte *)(*(long *)&this_00->field_0x8 + 0x20b) & 0x20) != 0) {
        uVar4 = (**(code **)(*(long *)this_00 + 0x80))(this_00,uVar6 & 0xffffffff);
      }
      uVar5 = *(uint *)(*(long *)&this_00->field_0x8 + 0x208);
      uVar5 = uVar5 >> 0x11 & 1 | uVar5 >> 0x14 & 2;
    }
    else {
      iVar3 = (*(pQVar1->super_QLayoutItem)._vptr_QLayoutItem[9])(&pQVar1->super_QLayoutItem);
      if ((char)iVar3 != '\0') {
        uVar4 = QLayout::totalHeightForWidth(this->layout,uVar9);
      }
      uVar5 = (**(code **)(*(long *)this->layout + 0x88))();
    }
    uVar11 = 200;
    if (200 < (int)uVar9) {
      uVar11 = uVar9;
    }
    if ((uVar5 & 1) == 0) {
      uVar11 = uVar9;
    }
    uVar9 = 100;
    if (100 < (int)uVar4) {
      uVar9 = uVar4;
    }
    if ((uVar5 & 2) == 0) {
      uVar9 = uVar4;
    }
    local_40 = QWidget::pos(this_00);
    lVar7 = QGuiApplication::screenAt(&local_40);
    if (lVar7 == 0) {
      QGuiApplication::primaryScreen();
    }
    auVar12 = QScreen::geometry();
    uVar4 = ((auVar12._8_4_ - auVar12._0_4_) * 2 + 2) / 3;
    if ((int)uVar11 < (int)uVar4) {
      uVar4 = uVar11;
    }
    uVar6 = (ulong)uVar4;
    uVar4 = ((auVar12._12_4_ - auVar12._4_4_) * 2 + 2) / 3;
    if ((int)uVar9 < (int)uVar4) {
      uVar4 = uVar9;
    }
    uVar10 = (ulong)uVar4;
    pQVar2 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if (pQVar2 == (QWExtra *)0x0) {
      _Var8._M_head_impl = (QTLWExtra *)0x0;
    }
    else {
      _Var8._M_head_impl =
           *(QTLWExtra **)
            &(pQVar2->topextra)._M_t.
             super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
    }
    if ((_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>)_Var8._M_head_impl !=
        (QTLWExtra *)0x0) {
      *(byte *)((long)_Var8._M_head_impl + 0xe1) = *(byte *)((long)_Var8._M_head_impl + 0xe1) | 2;
    }
  }
  if (((int)uVar6 < 0) || ((int)uVar10 < 0)) {
    QVar13 = QWidget::childrenRect(this_00);
    if (QVar13.y1.m_i.m_i + -1 != QVar13.y2.m_i.m_i || QVar13.x2.m_i.m_i != QVar13.x1.m_i.m_i + -1)
    {
      uVar6 = (ulong)(QVar13.x2.m_i.m_i + QVar13.x1.m_i.m_i + 1);
      uVar10 = (ulong)(QVar13.y2.m_i.m_i + QVar13.y1.m_i.m_i + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QSize)(uVar6 & 0xffffffff | uVar10 << 0x20);
  }
  __stack_chk_fail();
}

Assistant:

QSize QWidgetPrivate::adjustedSize() const
{
    Q_Q(const QWidget);

    QSize s = q->sizeHint();

    if (q->isWindow()) {
        Qt::Orientations exp;
        if (layout) {
            if (layout->hasHeightForWidth())
                s.setHeight(layout->totalHeightForWidth(s.width()));
            exp = layout->expandingDirections();
        } else
        {
            if (q->sizePolicy().hasHeightForWidth())
                s.setHeight(q->heightForWidth(s.width()));
            exp = q->sizePolicy().expandingDirections();
        }
        if (exp & Qt::Horizontal)
            s.setWidth(qMax(s.width(), 200));
        if (exp & Qt::Vertical)
            s.setHeight(qMax(s.height(), 100));

        QRect screen;
        if (const QScreen *screenAtPoint = QGuiApplication::screenAt(q->pos()))
            screen = screenAtPoint->geometry();
        else
            screen = QGuiApplication::primaryScreen()->geometry();

        s.setWidth(qMin(s.width(), screen.width()*2/3));
        s.setHeight(qMin(s.height(), screen.height()*2/3));

        if (QTLWExtra *extra = maybeTopData())
            extra->sizeAdjusted = true;
    }

    if (!s.isValid()) {
        QRect r = q->childrenRect(); // get children rectangle
        if (r.isNull())
            return s;
        s = r.size() + QSize(2 * r.x(), 2 * r.y());
    }

    return s;
}